

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::Prepare
          (ParameterSetupErrorsTest *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  uint local_84;
  GLuint i_1;
  GLuint all_depth_stencil_modes_count;
  GLenum all_depth_stencil_modes [2];
  GLuint i;
  bool is_valid;
  GLuint all_pnames_count;
  GLenum all_pnames [19];
  Functions *gl;
  ParameterSetupErrorsTest *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar4);
  (**(code **)(register0x00000000 + 0x400))(0xde1,1,&this->m_to_2D);
  dVar5 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c59);
  (**(code **)(stack0xffffffffffffffe8 + 0x400))(0x9100,1,&this->m_to_2D_ms);
  dVar5 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c5d);
  (**(code **)(stack0xffffffffffffffe8 + 0x400))(0x84f5,1,&this->m_to_rectangle);
  dVar5 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(dVar5,"glCreateTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c61);
  do {
    pcVar1 = *(code **)(stack0xffffffffffffffe8 + 0xcc8);
    this->m_to_invalid = this->m_to_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  dVar5 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(dVar5,"glIsTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x2c66);
  memcpy(&stack0xffffffffffffff98,&DAT_02a7a540,0x4c);
  bVar2 = true;
  do {
    if (!bVar2) {
      _i_1 = 0x190100001902;
      bVar2 = true;
      do {
        if (!bVar2) {
          return;
        }
        all_depth_stencil_modes[1]._3_1_ = 0;
        bVar2 = false;
        this->m_depth_stencil_mode_invalid = this->m_depth_stencil_mode_invalid + 1;
        for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
          if ((&i_1)[local_84] == this->m_depth_stencil_mode_invalid) {
            bVar2 = true;
            break;
          }
        }
      } while( true );
    }
    all_depth_stencil_modes[1]._3_1_ = 0;
    bVar2 = false;
    this->m_pname_invalid = this->m_pname_invalid + 1;
    for (all_depth_stencil_modes[0] = 0; all_depth_stencil_modes[0] < 0x13;
        all_depth_stencil_modes[0] = all_depth_stencil_modes[0] + 1) {
      if (all_pnames[(ulong)all_depth_stencil_modes[0] - 2] == this->m_pname_invalid) {
        bVar2 = true;
        break;
      }
    }
  } while( true );
}

Assistant:

void ParameterSetupErrorsTest::Prepare()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Auxiliary objects setup. */

	/* 2D */
	gl.createTextures(GL_TEXTURE_2D, 1, &m_to_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* 3D */
	gl.createTextures(GL_TEXTURE_2D_MULTISAMPLE, 1, &m_to_2D_ms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* RECTANGLE */
	gl.createTextures(GL_TEXTURE_RECTANGLE, 1, &m_to_rectangle);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTextures has failed");

	/* Invalid texture object. */
	while (gl.isTexture(++m_to_invalid))
		;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsTexture has failed");

	/* Invalid parameter name. */
	glw::GLenum all_pnames[] = { GL_DEPTH_STENCIL_TEXTURE_MODE,
								 GL_TEXTURE_BASE_LEVEL,
								 GL_TEXTURE_COMPARE_FUNC,
								 GL_TEXTURE_COMPARE_MODE,
								 GL_TEXTURE_LOD_BIAS,
								 GL_TEXTURE_MIN_FILTER,
								 GL_TEXTURE_MAG_FILTER,
								 GL_TEXTURE_MIN_LOD,
								 GL_TEXTURE_MAX_LOD,
								 GL_TEXTURE_MAX_LEVEL,
								 GL_TEXTURE_SWIZZLE_R,
								 GL_TEXTURE_SWIZZLE_G,
								 GL_TEXTURE_SWIZZLE_B,
								 GL_TEXTURE_SWIZZLE_A,
								 GL_TEXTURE_WRAP_S,
								 GL_TEXTURE_WRAP_T,
								 GL_TEXTURE_WRAP_R,
								 GL_TEXTURE_BORDER_COLOR,
								 GL_TEXTURE_SWIZZLE_RGBA };
	glw::GLuint all_pnames_count = sizeof(all_pnames) / sizeof(all_pnames[0]);

	bool is_valid = true;

	while (is_valid)
	{
		is_valid = false;
		++m_pname_invalid;

		for (glw::GLuint i = 0; i < all_pnames_count; ++i)
		{
			if (all_pnames[i] == m_pname_invalid)
			{
				is_valid = true;

				break;
			}
		}
	}

	/* Invalid depth stencil mode name. */
	glw::GLenum all_depth_stencil_modes[]	 = { GL_DEPTH_COMPONENT, GL_STENCIL_INDEX };
	glw::GLuint all_depth_stencil_modes_count = sizeof(all_depth_stencil_modes) / sizeof(all_depth_stencil_modes[0]);

	is_valid = true;

	while (is_valid)
	{
		is_valid = false;
		++m_depth_stencil_mode_invalid;

		for (glw::GLuint i = 0; i < all_depth_stencil_modes_count; ++i)
		{
			if (all_depth_stencil_modes[i] == m_depth_stencil_mode_invalid)
			{
				is_valid = true;

				break;
			}
		}
	}
}